

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O0

GLADapiproc glad_gl_get_proc(char *name,void *vuserptr)

{
  void *handle;
  undefined8 local_30;
  GLADapiproc result;
  _glad_gl_userptr userptr;
  void *vuserptr_local;
  char *name_local;
  
  handle = *vuserptr;
  local_30 = (GLADapiproc)0x0;
  if (*(code **)((long)vuserptr + 8) != (code *)0x0) {
    local_30 = (GLADapiproc)(**(code **)((long)vuserptr + 8))(name);
  }
  if (local_30 == (GLADapiproc)0x0) {
    local_30 = glad_dlsym_handle(handle,name);
  }
  return local_30;
}

Assistant:

static GLADapiproc glad_gl_get_proc(const char *name, void *vuserptr) {
    struct _glad_gl_userptr userptr = *(struct _glad_gl_userptr*) vuserptr;
    GLADapiproc result = NULL;

#ifndef __APPLE__
    if(userptr.gl_get_proc_address_ptr != NULL) {
        result = GLAD_GNUC_EXTENSION (GLADapiproc) userptr.gl_get_proc_address_ptr(name);
    }
#endif
    if(result == NULL) {
        result = glad_dlsym_handle(userptr.gl_handle, name);
    }

    return result;
}